

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  uint uVar1;
  Logger *pLVar2;
  VersionSet *edit;
  uint64_t uVar3;
  uint64_t uVar4;
  ManualCompaction *pMVar5;
  bool bVar6;
  int iVar7;
  FileMetaData *pFVar8;
  VersionEdit *pVVar9;
  char *pcVar10;
  CompactionState *this_00;
  undefined8 uVar11;
  char *local_208;
  char *local_1f8;
  char *local_1e8;
  ManualCompaction *m_1;
  undefined1 local_180 [16];
  CompactionState *compact;
  undefined1 local_14c [8];
  LevelSummaryStorage tmp;
  FileMetaData *f;
  Status status;
  InternalKey local_c8;
  undefined1 local_a1;
  InternalKey local_a0;
  byte local_79;
  InternalKey local_78;
  MemTable *local_48;
  ManualCompaction *m;
  InternalKey manual_end;
  Compaction *pCStack_18;
  bool is_manual;
  Compaction *c;
  DBImpl *this_local;
  
  port::Mutex::AssertHeld(&this->mutex_);
  if (this->imm_ == (MemTable *)0x0) {
    manual_end._31_1_ = this->manual_compaction_ != (ManualCompaction *)0x0;
    InternalKey::InternalKey((InternalKey *)&m);
    if ((manual_end._31_1_ & 1) == 0) {
      pCStack_18 = VersionSet::PickCompaction(this->versions_);
    }
    else {
      local_48 = (MemTable *)this->manual_compaction_;
      pCStack_18 = VersionSet::CompactRange
                             (this->versions_,
                              *(int *)&(local_48->comparator_).comparator.super_Comparator.
                                       _vptr_Comparator,
                              (InternalKey *)(local_48->comparator_).comparator.user_comparator_,
                              *(InternalKey **)&local_48->refs_);
      *(bool *)((long)&(local_48->comparator_).comparator.super_Comparator._vptr_Comparator + 4) =
           pCStack_18 == (Compaction *)0x0;
      if (pCStack_18 != (Compaction *)0x0) {
        iVar7 = Compaction::num_input_files(pCStack_18,0);
        pFVar8 = Compaction::input(pCStack_18,0,iVar7 + -1);
        InternalKey::operator=((InternalKey *)&m,&pFVar8->largest);
      }
      pLVar2 = (this->options_).info_log;
      uVar1 = *(uint *)&(local_48->comparator_).comparator.super_Comparator._vptr_Comparator;
      local_79 = 0;
      if ((InternalKey *)(local_48->comparator_).comparator.user_comparator_ == (InternalKey *)0x0)
      {
        local_1e8 = "(begin)";
      }
      else {
        InternalKey::DebugString_abi_cxx11_(&local_78);
        local_79 = 1;
        local_1e8 = (char *)std::__cxx11::string::c_str();
      }
      local_a1 = 0;
      if (*(InternalKey **)&local_48->refs_ == (InternalKey *)0x0) {
        local_1f8 = "(end)";
      }
      else {
        InternalKey::DebugString_abi_cxx11_(&local_a0);
        local_a1 = 1;
        local_1f8 = (char *)std::__cxx11::string::c_str();
      }
      status.state_._7_1_ = 0;
      if (((ulong)(local_48->comparator_).comparator.super_Comparator._vptr_Comparator & 0x100000000
          ) == 0) {
        InternalKey::DebugString_abi_cxx11_(&local_c8);
        status.state_._7_1_ = 1;
        local_208 = (char *)std::__cxx11::string::c_str();
      }
      else {
        local_208 = "(end)";
      }
      Log(pLVar2,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",(ulong)uVar1,
          local_1e8,local_1f8,local_208);
      if ((status.state_._7_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_c8);
      }
      if ((local_a1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a0);
      }
      if ((local_79 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
    Status::Status((Status *)&f);
    if (pCStack_18 != (Compaction *)0x0) {
      if (((manual_end._31_1_ & 1) == 0) && (bVar6 = Compaction::IsTrivialMove(pCStack_18), bVar6))
      {
        iVar7 = Compaction::num_input_files(pCStack_18,0);
        if (iVar7 != 1) {
          __assert_fail("c->num_input_files(0) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                        ,0x2cf,"void leveldb::DBImpl::BackgroundCompaction()");
        }
        pFVar8 = Compaction::input(pCStack_18,0,0);
        pVVar9 = Compaction::edit(pCStack_18);
        iVar7 = Compaction::level(pCStack_18);
        VersionEdit::DeleteFile(pVVar9,iVar7,pFVar8->number);
        pVVar9 = Compaction::edit(pCStack_18);
        iVar7 = Compaction::level(pCStack_18);
        VersionEdit::AddFile
                  (pVVar9,iVar7 + 1,pFVar8->number,pFVar8->file_size,&pFVar8->smallest,
                   &pFVar8->largest);
        edit = this->versions_;
        pVVar9 = Compaction::edit(pCStack_18);
        VersionSet::LogAndApply
                  ((VersionSet *)(tmp.buffer + 0x5c),(VersionEdit *)edit,(Mutex *)pVVar9);
        Status::operator=((Status *)&f,(Status *)(tmp.buffer + 0x5c));
        Status::~Status((Status *)(tmp.buffer + 0x5c));
        bVar6 = Status::ok((Status *)&f);
        if (!bVar6) {
          RecordBackgroundError(this,(Status *)&f);
        }
        pLVar2 = (this->options_).info_log;
        uVar3 = pFVar8->number;
        iVar7 = Compaction::level(pCStack_18);
        uVar4 = pFVar8->file_size;
        Status::ToString_abi_cxx11_((Status *)&compact);
        uVar11 = std::__cxx11::string::c_str();
        pcVar10 = VersionSet::LevelSummary(this->versions_,(LevelSummaryStorage *)local_14c);
        Log(pLVar2,"Moved #%lld to level-%d %lld bytes %s: %s\n",uVar3,(ulong)(iVar7 + 1),uVar4,
            uVar11,pcVar10);
        std::__cxx11::string::~string((string *)&compact);
      }
      else {
        this_00 = (CompactionState *)operator_new(0x40);
        CompactionState::CompactionState(this_00,pCStack_18);
        local_180._8_8_ = this_00;
        DoCompactionWork((DBImpl *)local_180,(CompactionState *)this);
        Status::operator=((Status *)&f,(Status *)local_180);
        Status::~Status((Status *)local_180);
        bVar6 = Status::ok((Status *)&f);
        if (!bVar6) {
          RecordBackgroundError(this,(Status *)&f);
        }
        CleanupCompaction(this,(CompactionState *)local_180._8_8_);
        Compaction::ReleaseInputs(pCStack_18);
        DeleteObsoleteFiles(this);
      }
    }
    if (pCStack_18 != (Compaction *)0x0) {
      Compaction::~Compaction(pCStack_18);
      operator_delete(pCStack_18);
    }
    bVar6 = Status::ok((Status *)&f);
    if ((!bVar6) &&
       (bVar6 = std::atomic<bool>::load(&this->shutting_down_,memory_order_acquire), !bVar6)) {
      pLVar2 = (this->options_).info_log;
      Status::ToString_abi_cxx11_((Status *)&m_1);
      uVar11 = std::__cxx11::string::c_str();
      Log(pLVar2,"Compaction error: %s",uVar11);
      std::__cxx11::string::~string((string *)&m_1);
    }
    if ((manual_end._31_1_ & 1) != 0) {
      pMVar5 = this->manual_compaction_;
      bVar6 = Status::ok((Status *)&f);
      if (!bVar6) {
        pMVar5->done = true;
      }
      if ((pMVar5->done & 1U) == 0) {
        InternalKey::operator=(&pMVar5->tmp_storage,(InternalKey *)&m);
        pMVar5->begin = &pMVar5->tmp_storage;
      }
      this->manual_compaction_ = (ManualCompaction *)0x0;
    }
    Status::~Status((Status *)&f);
    InternalKey::~InternalKey((InternalKey *)&m);
  }
  else {
    CompactMemTable(this);
  }
  return;
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->DeleteFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    DeleteObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}